

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

void HTS_Engine_save_information(HTS_Engine *engine,FILE *fp)

{
  double *pdVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  FILE *pFVar7;
  HTS_Boolean HVar8;
  HTS_ModelSet *ms_00;
  HTS_Label *label_00;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  HTS_ModelSet *pHVar12;
  FILE *in_RSI;
  undefined8 *in_RDI;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  HTS_PStreamSet *pss;
  HTS_SStreamSet *sss;
  HTS_Label *label;
  HTS_ModelSet *ms;
  HTS_Condition *condition;
  double temp;
  size_t n;
  size_t m;
  size_t l;
  size_t k;
  size_t j;
  size_t i;
  size_t *in_stack_fffffffffffffe28;
  HTS_ModelSet *in_stack_fffffffffffffe30;
  HTS_ModelSet *in_stack_fffffffffffffe38;
  HTS_ModelSet *in_stack_fffffffffffffe40;
  HTS_ModelSet *pHVar20;
  HTS_SStreamSet *in_stack_fffffffffffffe60;
  double local_88;
  double local_48;
  size_t local_40;
  undefined8 local_38;
  HTS_ModelSet *local_30;
  HTS_ModelSet *local_28;
  ulong local_20;
  ulong local_18;
  FILE *local_10;
  
  ms_00 = (HTS_ModelSet *)(in_RDI + 0x16);
  label_00 = (HTS_Label *)(in_RDI + 0x25);
  local_10 = in_RSI;
  fprintf(in_RSI,"[Global parameter]\n");
  fprintf(local_10,"Sampring frequency                     -> %8lu(Hz)\n",*in_RDI);
  fprintf(local_10,"Frame period                           -> %8lu(point)\n",in_RDI[1]);
  uVar2 = in_RDI[1];
  auVar14._8_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar14._0_8_ = uVar2;
  auVar14._12_4_ = 0x45300000;
  uVar3 = *in_RDI;
  auVar16._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar16._0_8_ = uVar3;
  auVar16._12_4_ = 0x45300000;
  fprintf(local_10,"                                          %8.5f(msec)\n",
          (((auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1000.0) /
          ((auVar16._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)));
  fprintf(local_10,"All-pass constant                      -> %8.5f\n",
          (double)(float)(double)in_RDI[0xb]);
  if (in_RDI[9] == 0) {
    local_88 = 0.0;
  }
  else {
    uVar2 = in_RDI[9];
    auVar17._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar17._0_8_ = uVar2;
    auVar17._12_4_ = 0x45300000;
    local_88 = -1.0 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  }
  fprintf(local_10,"Gamma                                  -> %8.5f\n",(double)(float)local_88);
  if (in_RDI[9] != 0) {
    if (*(char *)(in_RDI + 10) == '\x01') {
      fprintf(local_10,"Log gain flag                          ->     TRUE\n");
    }
    else {
      fprintf(local_10,"Log gain flag                          ->    FALSE\n");
    }
  }
  fprintf(local_10,"Postfiltering coefficient              -> %8.5f\n",
          (double)(float)(double)in_RDI[0xc]);
  fprintf(local_10,"Audio buffer size                      -> %8lu(sample)\n",in_RDI[2]);
  fprintf(local_10,"\n");
  fprintf(local_10,"[Duration parameter]\n");
  pFVar7 = local_10;
  sVar9 = HTS_ModelSet_get_nstate(ms_00);
  fprintf(pFVar7,"Number of states                       -> %8lu\n",sVar9);
  pFVar7 = local_10;
  sVar9 = HTS_ModelSet_get_nvoices(ms_00);
  fprintf(pFVar7,"         Interpolation size            -> %8lu\n",sVar9);
  local_48 = 0.0;
  for (local_18 = 0; uVar5 = local_18, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
      local_18 = local_18 + 1) {
    local_48 = *(double *)(in_RDI[0xe] + local_18 * 8) + local_48;
  }
  for (local_18 = 0; uVar5 = local_18, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
      local_18 = local_18 + 1) {
    dVar13 = *(double *)(in_RDI[0xe] + local_18 * 8);
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      *(double *)(in_RDI[0xe] + local_18 * 8) = *(double *)(in_RDI[0xe] + local_18 * 8) / local_48;
    }
  }
  for (local_18 = 0; uVar5 = local_18, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
      local_18 = local_18 + 1) {
    fprintf(local_10,"         Interpolation weight[%2lu]      -> %8.0f(%%)\n",
            (double)(float)(*(double *)(in_RDI[0xe] + local_18 * 8) * 100.0),local_18);
  }
  fprintf(local_10,"\n");
  fprintf(local_10,"[Stream parameter]\n");
  for (local_18 = 0; uVar5 = local_18, sVar9 = HTS_ModelSet_get_nstream(ms_00), pFVar7 = local_10,
      uVar6 = local_18, uVar5 < sVar9; local_18 = local_18 + 1) {
    sVar9 = HTS_ModelSet_get_vector_length(ms_00,local_18);
    fprintf(pFVar7,"Stream[%2lu] vector length               -> %8lu\n",uVar6,sVar9);
    pFVar7 = local_10;
    sVar9 = HTS_ModelSet_get_window_size(ms_00,local_18);
    fprintf(pFVar7,"           Dynamic window size         -> %8lu\n",sVar9);
    pFVar7 = local_10;
    sVar9 = HTS_ModelSet_get_nvoices(ms_00);
    fprintf(pFVar7,"           Interpolation size          -> %8lu\n",sVar9);
    local_48 = 0.0;
    for (local_20 = 0; uVar5 = local_20, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
        local_20 = local_20 + 1) {
      local_48 = *(double *)(*(long *)(in_RDI[0xf] + local_20 * 8) + local_18 * 8) + local_48;
    }
    for (local_20 = 0; uVar5 = local_20, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
        local_20 = local_20 + 1) {
      dVar13 = *(double *)(*(long *)(in_RDI[0xf] + local_20 * 8) + local_18 * 8);
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        lVar4 = *(long *)(in_RDI[0xf] + local_20 * 8);
        *(double *)(lVar4 + local_18 * 8) = *(double *)(lVar4 + local_18 * 8) / local_48;
      }
    }
    for (local_20 = 0; uVar5 = local_20, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
        local_20 = local_20 + 1) {
      fprintf(local_10,"           Interpolation weight[%2lu]    -> %8.0f(%%)\n",
              (double)(float)(*(double *)(*(long *)(in_RDI[0xf] + local_20 * 8) + local_18 * 8) *
                             100.0),local_20);
    }
    HVar8 = HTS_ModelSet_is_msd(ms_00,local_18);
    if (HVar8 == '\0') {
      fprintf(local_10,"           MSD flag                    ->    FALSE\n");
    }
    else {
      fprintf(local_10,"           MSD flag                    ->     TRUE\n");
      fprintf(local_10,"           MSD threshold               -> %8.5f\n",
              *(undefined8 *)(in_RDI[5] + local_18 * 8));
    }
    HVar8 = HTS_ModelSet_use_gv(ms_00,local_18);
    if (HVar8 == '\0') {
      fprintf(local_10,"           GV flag                     ->    FALSE\n");
    }
    else {
      fprintf(local_10,"           GV flag                     ->     TRUE\n");
      fprintf(local_10,"           GV weight                   -> %8.0f(%%)\n",
              (double)(float)(*(double *)(in_RDI[6] + local_18 * 8) * 100.0));
      pFVar7 = local_10;
      sVar9 = HTS_ModelSet_get_nvoices(ms_00);
      fprintf(pFVar7,"           GV interpolation size       -> %8lu\n",sVar9);
      local_48 = 0.0;
      for (local_20 = 0; uVar5 = local_20, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
          local_20 = local_20 + 1) {
        local_48 = *(double *)(*(long *)(in_RDI[0x10] + local_20 * 8) + local_18 * 8) + local_48;
      }
      for (local_20 = 0; uVar5 = local_20, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
          local_20 = local_20 + 1) {
        dVar13 = *(double *)(*(long *)(in_RDI[0x10] + local_20 * 8) + local_18 * 8);
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          lVar4 = *(long *)(in_RDI[0x10] + local_20 * 8);
          *(double *)(lVar4 + local_18 * 8) = *(double *)(lVar4 + local_18 * 8) / local_48;
        }
      }
      for (local_20 = 0; uVar5 = local_20, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
          local_20 = local_20 + 1) {
        fprintf(local_10,"           GV interpolation weight[%2lu] -> %8.0f(%%)\n",
                (double)(float)(*(double *)(*(long *)(in_RDI[0x10] + local_20 * 8) + local_18 * 8) *
                               100.0),local_20);
      }
    }
  }
  fprintf(local_10,"\n");
  fprintf(local_10,"[Generated sequence]\n");
  pFVar7 = local_10;
  sVar9 = HTS_Label_get_size(label_00);
  fprintf(pFVar7,"Number of HMMs                         -> %8lu\n",sVar9);
  pFVar7 = local_10;
  sVar9 = HTS_Label_get_size(label_00);
  sVar10 = HTS_ModelSet_get_nstate(ms_00);
  fprintf(pFVar7,"Number of stats                        -> %8lu\n",sVar9 * sVar10);
  pFVar7 = local_10;
  sVar9 = HTS_PStreamSet_get_total_frame((HTS_PStreamSet *)(in_RDI + 0x2d));
  auVar15._8_4_ = (int)(sVar9 >> 0x20);
  auVar15._0_8_ = sVar9;
  auVar15._12_4_ = 0x45300000;
  uVar2 = in_RDI[1];
  auVar18._8_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar18._0_8_ = uVar2;
  auVar18._12_4_ = 0x45300000;
  uVar3 = *in_RDI;
  auVar19._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar19._0_8_ = uVar3;
  auVar19._12_4_ = 0x45300000;
  fprintf(pFVar7,"Length of this speech                  -> %8.3f(sec)\n",
          (double)(float)((((auVar15._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0)) *
                          ((auVar18._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))) /
                         ((auVar19._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0))));
  pFVar7 = local_10;
  sVar9 = HTS_PStreamSet_get_total_frame((HTS_PStreamSet *)(in_RDI + 0x2d));
  fprintf(pFVar7,"                                       -> %8lu(frames)\n",sVar9 * in_RDI[1]);
  for (local_18 = 0; uVar5 = local_18, sVar9 = HTS_Label_get_size(label_00), uVar5 < sVar9;
      local_18 = local_18 + 1) {
    fprintf(local_10,"HMM[%2lu]\n",local_18);
    pFVar7 = local_10;
    pcVar11 = HTS_Label_get_string(label_00,local_18);
    fprintf(pFVar7,"  Name                                 -> %s\n",pcVar11);
    fprintf(local_10,"  Duration\n");
    for (local_20 = 0; uVar5 = local_20, sVar9 = HTS_ModelSet_get_nvoices(ms_00), uVar5 < sVar9;
        local_20 = local_20 + 1) {
      fprintf(local_10,"    Interpolation[%2lu]\n",local_20);
      HTS_Label_get_string(label_00,local_18);
      HTS_ModelSet_get_duration_index
                (in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                 (char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(size_t *)0x20b51f);
      fprintf(local_10,"      Tree index                       -> %8lu\n",local_28);
      fprintf(local_10,"      PDF index                        -> %8lu\n",local_30);
    }
    for (local_20 = 0; uVar5 = local_20, sVar9 = HTS_ModelSet_get_nstate(ms_00), uVar5 < sVar9;
        local_20 = local_20 + 1) {
      fprintf(local_10,"  State[%2lu]\n",local_20 + 2);
      pFVar7 = local_10;
      uVar5 = local_18;
      sVar9 = HTS_ModelSet_get_nstate(ms_00);
      sVar9 = HTS_SStreamSet_get_duration
                        ((HTS_SStreamSet *)(in_RDI + 0x27),uVar5 * sVar9 + local_20);
      fprintf(pFVar7,"    Length                             -> %8lu(frames)\n",sVar9);
      for (local_28 = (HTS_ModelSet *)0x0; pHVar20 = local_28,
          pHVar12 = (HTS_ModelSet *)HTS_ModelSet_get_nstream(ms_00), pHVar20 < pHVar12;
          local_28 = (HTS_ModelSet *)((long)&local_28->hts_voice_version + 1)) {
        fprintf(local_10,"    Stream[%2lu]\n",local_28);
        HVar8 = HTS_ModelSet_is_msd(ms_00,(size_t)local_28);
        uVar5 = local_18;
        pHVar20 = local_28;
        if (HVar8 != '\0') {
          in_stack_fffffffffffffe60 = (HTS_SStreamSet *)(in_RDI + 0x27);
          sVar9 = HTS_ModelSet_get_nstate(ms_00);
          dVar13 = HTS_SStreamSet_get_msd
                             (in_stack_fffffffffffffe60,(size_t)pHVar20,uVar5 * sVar9 + local_20);
          pdVar1 = (double *)(in_RDI[5] + (long)local_28 * 8);
          if (dVar13 < *pdVar1 || dVar13 == *pdVar1) {
            fprintf(local_10,"      MSD flag                         ->    FALSE\n");
          }
          else {
            fprintf(local_10,"      MSD flag                         ->     TRUE\n");
          }
        }
        local_30 = (HTS_ModelSet *)0x0;
        while (pHVar20 = local_30, pHVar12 = (HTS_ModelSet *)HTS_ModelSet_get_nvoices(ms_00),
              pHVar20 < pHVar12) {
          fprintf(local_10,"      Interpolation[%2lu]\n",local_30);
          sVar9 = local_20 + 2;
          in_stack_fffffffffffffe30 = ms_00;
          in_stack_fffffffffffffe38 = local_30;
          in_stack_fffffffffffffe40 = local_28;
          HTS_Label_get_string(label_00,local_18);
          in_stack_fffffffffffffe28 = &local_40;
          HTS_ModelSet_get_parameter_index
                    (pHVar20,sVar9,(size_t)in_stack_fffffffffffffe40,
                     (size_t)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe28,(size_t *)in_stack_fffffffffffffe60);
          fprintf(local_10,"        Tree index                     -> %8lu\n",local_38);
          fprintf(local_10,"        PDF index                      -> %8lu\n",local_40);
          local_30 = (HTS_ModelSet *)((long)&local_30->hts_voice_version + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void HTS_Engine_save_information(HTS_Engine * engine, FILE * fp)
{
   size_t i, j, k, l, m, n;
   double temp;
   HTS_Condition *condition = &engine->condition;
   HTS_ModelSet *ms = &engine->ms;
   HTS_Label *label = &engine->label;
   HTS_SStreamSet *sss = &engine->sss;
   HTS_PStreamSet *pss = &engine->pss;

   /* global parameter */
   fprintf(fp, "[Global parameter]\n");
   fprintf(fp, "Sampring frequency                     -> %8lu(Hz)\n", (unsigned long) condition->sampling_frequency);
   fprintf(fp, "Frame period                           -> %8lu(point)\n", (unsigned long) condition->fperiod);
   fprintf(fp, "                                          %8.5f(msec)\n", 1e+3 * condition->fperiod / condition->sampling_frequency);
   fprintf(fp, "All-pass constant                      -> %8.5f\n", (float) condition->alpha);
   fprintf(fp, "Gamma                                  -> %8.5f\n", (float) (condition->stage == 0 ? 0.0 : -1.0 / condition->stage));
   if (condition->stage != 0) {
      if (condition->use_log_gain == TRUE)
         fprintf(fp, "Log gain flag                          ->     TRUE\n");
      else
         fprintf(fp, "Log gain flag                          ->    FALSE\n");
   }
   fprintf(fp, "Postfiltering coefficient              -> %8.5f\n", (float) condition->beta);
   fprintf(fp, "Audio buffer size                      -> %8lu(sample)\n", (unsigned long) condition->audio_buff_size);
   fprintf(fp, "\n");

   /* duration parameter */
   fprintf(fp, "[Duration parameter]\n");
   fprintf(fp, "Number of states                       -> %8lu\n", (unsigned long) HTS_ModelSet_get_nstate(ms));
   fprintf(fp, "         Interpolation size            -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
   /* check interpolation */
   for (i = 0, temp = 0.0; i < HTS_ModelSet_get_nvoices(ms); i++)
      temp += condition->duration_iw[i];
   for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
      if (condition->duration_iw[i] != 0.0)
         condition->duration_iw[i] /= temp;
   for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
      fprintf(fp, "         Interpolation weight[%2lu]      -> %8.0f(%%)\n", (unsigned long) i, (float) (100 * condition->duration_iw[i]));
   fprintf(fp, "\n");

   fprintf(fp, "[Stream parameter]\n");
   for (i = 0; i < HTS_ModelSet_get_nstream(ms); i++) {
      /* stream parameter */
      fprintf(fp, "Stream[%2lu] vector length               -> %8lu\n", (unsigned long) i, (unsigned long) HTS_ModelSet_get_vector_length(ms, i));
      fprintf(fp, "           Dynamic window size         -> %8lu\n", (unsigned long) HTS_ModelSet_get_window_size(ms, i));
      /* interpolation */
      fprintf(fp, "           Interpolation size          -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
      for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
         temp += condition->parameter_iw[j][i];
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
         if (condition->parameter_iw[j][i] != 0.0)
            condition->parameter_iw[j][i] /= temp;
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
         fprintf(fp, "           Interpolation weight[%2lu]    -> %8.0f(%%)\n", (unsigned long) j, (float) (100 * condition->parameter_iw[j][i]));
      /* MSD */
      if (HTS_ModelSet_is_msd(ms, i)) { /* for MSD */
         fprintf(fp, "           MSD flag                    ->     TRUE\n");
         fprintf(fp, "           MSD threshold               -> %8.5f\n", condition->msd_threshold[i]);
      } else {                  /* for non MSD */
         fprintf(fp, "           MSD flag                    ->    FALSE\n");
      }
      /* GV */
      if (HTS_ModelSet_use_gv(ms, i)) {
         fprintf(fp, "           GV flag                     ->     TRUE\n");
         fprintf(fp, "           GV weight                   -> %8.0f(%%)\n", (float) (100 * condition->gv_weight[i]));
         fprintf(fp, "           GV interpolation size       -> %8lu\n", (unsigned long) HTS_ModelSet_get_nvoices(ms));
         /* interpolation */
         for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
            temp += condition->gv_iw[j][i];
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            if (condition->gv_iw[j][i] != 0.0)
               condition->gv_iw[j][i] /= temp;
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            fprintf(fp, "           GV interpolation weight[%2lu] -> %8.0f(%%)\n", (unsigned long) j, (float) (100 * condition->gv_iw[j][i]));
      } else {
         fprintf(fp, "           GV flag                     ->    FALSE\n");
      }
   }
   fprintf(fp, "\n");

   /* generated sequence */
   fprintf(fp, "[Generated sequence]\n");
   fprintf(fp, "Number of HMMs                         -> %8lu\n", (unsigned long) HTS_Label_get_size(label));
   fprintf(fp, "Number of stats                        -> %8lu\n", (unsigned long) HTS_Label_get_size(label) * HTS_ModelSet_get_nstate(ms));
   fprintf(fp, "Length of this speech                  -> %8.3f(sec)\n", (float) ((double) HTS_PStreamSet_get_total_frame(pss) * condition->fperiod / condition->sampling_frequency));
   fprintf(fp, "                                       -> %8lu(frames)\n", (unsigned long) HTS_PStreamSet_get_total_frame(pss) * condition->fperiod);

   for (i = 0; i < HTS_Label_get_size(label); i++) {
      fprintf(fp, "HMM[%2lu]\n", (unsigned long) i);
      fprintf(fp, "  Name                                 -> %s\n", HTS_Label_get_string(label, i));
      fprintf(fp, "  Duration\n");
      for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++) {
         fprintf(fp, "    Interpolation[%2lu]\n", (unsigned long) j);
         HTS_ModelSet_get_duration_index(ms, j, HTS_Label_get_string(label, i), &k, &l);
         fprintf(fp, "      Tree index                       -> %8lu\n", (unsigned long) k);
         fprintf(fp, "      PDF index                        -> %8lu\n", (unsigned long) l);
      }
      for (j = 0; j < HTS_ModelSet_get_nstate(ms); j++) {
         fprintf(fp, "  State[%2lu]\n", (unsigned long) j + 2);
         fprintf(fp, "    Length                             -> %8lu(frames)\n", (unsigned long) HTS_SStreamSet_get_duration(sss, i * HTS_ModelSet_get_nstate(ms) + j));
         for (k = 0; k < HTS_ModelSet_get_nstream(ms); k++) {
            fprintf(fp, "    Stream[%2lu]\n", (unsigned long) k);
            if (HTS_ModelSet_is_msd(ms, k)) {
               if (HTS_SStreamSet_get_msd(sss, k, i * HTS_ModelSet_get_nstate(ms) + j) > condition->msd_threshold[k])
                  fprintf(fp, "      MSD flag                         ->     TRUE\n");
               else
                  fprintf(fp, "      MSD flag                         ->    FALSE\n");
            }
            for (l = 0; l < HTS_ModelSet_get_nvoices(ms); l++) {
               fprintf(fp, "      Interpolation[%2lu]\n", (unsigned long) l);
               HTS_ModelSet_get_parameter_index(ms, l, k, j + 2, HTS_Label_get_string(label, i), &m, &n);
               fprintf(fp, "        Tree index                     -> %8lu\n", (unsigned long) m);
               fprintf(fp, "        PDF index                      -> %8lu\n", (unsigned long) n);
            }
         }
      }
   }
}